

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O0

bool fs_is_safe_name(string_view filename)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  undefined1 local_20 [8];
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  local_20 = (undefined1  [8])filename._M_len;
  bVar1 = fs_is_reserved(filename);
  if (bVar1) {
    filename_local._M_str._7_1_ = false;
  }
  else {
    __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
    __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
    filename_local._M_str._7_1_ =
         std::all_of<char_const*,bool(*)(char)>(__first,__last,fs_is_safe_char);
  }
  return filename_local._M_str._7_1_;
}

Assistant:

bool
fs_is_safe_name(std::string_view filename)
{
  // check that only shell-safe characters are in filename
  // hasn't been fully tested yet across operating systems and file systems--let us know if character(s) should be unsafe
  // does NOT check for reserved or device names
  // => filenames only, not paths
  // https://learn.microsoft.com/en-us/windows/win32/fileio/naming-a-file
  // we do not consider whitespaces, quotes, or ticks safe, as they can be confusing in shell scripts and command line usage

  if(fs_is_reserved(filename))
    return false;

#ifdef __cpp_lib_ranges // C++20
  return std::ranges::all_of(filename, fs_is_safe_char);
#else // C++11
  return std::all_of(filename.begin(), filename.end(), fs_is_safe_char);
#endif
}